

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

char * mg_md5(char *buf,...)

{
  byte bVar1;
  char in_AL;
  undefined8 *puVar2;
  ulong uVar3;
  undefined8 *puVar4;
  size_t sVar5;
  uint uVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint uVar7;
  uint uVar8;
  undefined8 in_RSI;
  void *pvVar9;
  long lVar10;
  undefined8 in_R8;
  undefined8 in_R9;
  char *__s;
  bool bVar11;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  uchar hash [16];
  uint32_t local_148 [2];
  uchar auStack_140 [8];
  undefined8 local_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined4 local_a8;
  undefined4 local_98;
  undefined4 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Da;
    local_98 = in_XMM2_Da;
    local_88 = in_XMM3_Da;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_148 = (uint32_t  [2])0xefcdab8967452301;
  auStack_140[0] = 0xfe;
  auStack_140[1] = 0xdc;
  auStack_140[2] = 0xba;
  auStack_140[3] = 0x98;
  auStack_140[4] = 'v';
  auStack_140[5] = 'T';
  auStack_140[6] = '2';
  auStack_140[7] = '\x10';
  local_138 = 0;
  puVar2 = (undefined8 *)&stack0x00000008;
  uVar8 = 8;
  local_e8[1] = in_RSI;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  do {
    while( true ) {
      if (uVar8 < 0x29) {
        uVar3 = (ulong)uVar8;
        uVar8 = uVar8 + 8;
        puVar4 = (undefined8 *)((long)local_e8 + uVar3);
      }
      else {
        puVar4 = puVar2;
        puVar2 = puVar2 + 1;
      }
      __s = (char *)*puVar4;
      if (__s == (char *)0x0) {
        uVar8 = (uint)local_138 >> 3 & 0x3f;
        pvVar9 = (void *)((long)&local_130 + (ulong)uVar8 + 1);
        *(undefined1 *)((long)&local_130 + (ulong)uVar8) = 0x80;
        if ((uVar8 ^ 0x3f) < 8) {
          memset(pvVar9,0,(ulong)(uVar8 ^ 0x3f));
          MD5Transform(local_148,(uint32_t *)&local_130);
          local_110 = 0;
          uStack_108 = 0;
          local_120 = 0;
          uStack_118 = 0;
          local_130 = 0;
          uStack_128 = 0;
          local_100 = 0;
        }
        else {
          memset(pvVar9,0,(ulong)(0x37 - uVar8));
        }
        uStack_f8 = local_138;
        MD5Transform(local_148,(uint32_t *)&local_130);
        hash._0_8_ = local_148;
        hash[8] = auStack_140[0];
        hash[9] = auStack_140[1];
        hash[10] = auStack_140[2];
        hash[0xb] = auStack_140[3];
        hash[0xc] = auStack_140[4];
        hash[0xd] = auStack_140[5];
        hash[0xe] = auStack_140[6];
        hash[0xf] = auStack_140[7];
        for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
          bVar1 = hash[lVar10];
          buf[lVar10 * 2] = "0123456789abcdef"[bVar1 >> 4];
          buf[lVar10 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
        }
        buf[0x20] = '\0';
        return buf;
      }
      sVar5 = strlen(__s);
      uVar6 = (uint)local_138;
      uVar7 = (uint)sVar5;
      local_138 = CONCAT44(local_138._4_4_ + ((uint)(sVar5 >> 0x1d) & 7) +
                           (uint)CARRY4(uVar7 * 8,(uint)local_138),uVar7 * 8 + (uint)local_138);
      uVar6 = uVar6 >> 3 & 0x3f;
      if (uVar6 != 0) break;
LAB_00106ecb:
      for (sVar5 = (size_t)uVar7; 0x3f < (uint)sVar5; sVar5 = sVar5 - 0x40) {
        local_130 = *(undefined8 *)__s;
        uStack_128 = *(undefined8 *)(__s + 8);
        local_120 = *(undefined8 *)(__s + 0x10);
        uStack_118 = *(undefined8 *)(__s + 0x18);
        local_110 = *(undefined8 *)(__s + 0x20);
        uStack_108 = *(undefined8 *)(__s + 0x28);
        local_100 = *(undefined8 *)(__s + 0x30);
        uStack_f8 = *(undefined8 *)(__s + 0x38);
        MD5Transform(local_148,(uint32_t *)&local_130);
        __s = __s + 0x40;
      }
      memcpy(&local_130,__s,sVar5);
    }
    pvVar9 = (void *)((long)&local_130 + (ulong)uVar6);
    uVar6 = 0x40 - uVar6;
    bVar11 = uVar6 <= uVar7;
    uVar7 = uVar7 - uVar6;
    if (bVar11) {
      memcpy(pvVar9,__s,(ulong)uVar6);
      MD5Transform(local_148,(uint32_t *)&local_130);
      __s = __s + uVar6;
      goto LAB_00106ecb;
    }
    memcpy(pvVar9,__s,sVar5 & 0xffffffff);
  } while( true );
}

Assistant:

char *mg_md5(char buf[33], ...) {
  unsigned char hash[16];
  const char *p;
  va_list ap;
  MD5_CTX ctx;

  MD5Init(&ctx);

  va_start(ap, buf);
  while ((p = va_arg(ap, const char *)) != NULL) {
    MD5Update(&ctx, (const unsigned char *) p, (unsigned) strlen(p));
  }
  va_end(ap);

  MD5Final(hash, &ctx);
  bin2str(buf, hash, sizeof(hash));
  return buf;
}